

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O2

bool __thiscall Assimp::BlobIOSystem::Exists(BlobIOSystem *this,char *pFile)

{
  const_iterator cVar1;
  allocator<char> local_39;
  key_type local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pFile,&local_39);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->created)._M_t,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (_Rb_tree_header *)cVar1._M_node != &(this->created)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

virtual bool Exists( const char* pFile) const {
        return created.find(std::string(pFile)) != created.end();
    }